

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  undefined1 *puVar2;
  TestError *pTVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  string *psVar8;
  long lVar9;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string example_struct;
  string shader_source;
  
  example_struct._M_dataplus._M_p = (pointer)&example_struct.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_struct,
             "struct light {\n    float[2] intensity;\n    int[2] position;\n};\n","");
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  lVar9 = 1;
  do {
    std::__cxx11::string::_M_assign((string *)&shader_source);
    std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"    light my_light_object","");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"[2]","");
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_90,this,local_d0,(string *)local_b0,lVar9);
    std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    std::__cxx11::string::append((char *)&shader_source);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x594);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    puVar6 = empty_string_abi_cxx11_;
    puVar5 = empty_string_abi_cxx11_;
    puVar4 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    puVar2 = (undefined1 *)&shader_source;
    psVar8 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar2 = empty_string_abi_cxx11_;
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      puVar4 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar7 = default_geometry_shader_source_abi_cxx11_;
      psVar8 = &shader_source;
      break;
    case VERTEX_SHADER_TYPE:
      puVar5 = default_tc_shader_source_abi_cxx11_;
      puVar6 = (undefined1 *)&shader_source;
      goto LAB_00b4e6cb;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      puVar4 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&shader_source;
      goto LAB_00b4e70c;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar5 = (undefined1 *)&shader_source;
      puVar6 = default_vertex_shader_source_abi_cxx11_;
LAB_00b4e6cb:
      puVar4 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b4e705:
      puVar7 = default_geometry_shader_source_abi_cxx11_;
LAB_00b4e70c:
      puVar2 = empty_string_abi_cxx11_;
      psVar8 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      puVar4 = (undefined1 *)&shader_source;
      goto LAB_00b4e705;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x597);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,puVar6,puVar5,puVar4,puVar7,psVar8,puVar2,1,0);
    lVar9 = lVar9 + 1;
    if (lVar9 == 9) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)example_struct._M_dataplus._M_p != &example_struct.field_2) {
        operator_delete(example_struct._M_dataplus._M_p,
                        example_struct.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsStructTypes3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "};\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += this->extend_string("    light my_light_object", "[2]", max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}